

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image_simd.cpp
# Opt level: O1

void compute_integral_img_simd_early_cast_int(uint8_t *gray_image,integral_image *iimage)

{
  float *pfVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  float *pfVar5;
  float *pfVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [32];
  undefined8 uVar21;
  byte bVar22;
  byte bVar23;
  ulong uVar24;
  long lVar25;
  float *pfVar26;
  int iVar27;
  ulong uVar28;
  uint8_t *puVar29;
  uint uVar30;
  ulong uVar31;
  float fVar32;
  float *pfVar33;
  long lVar34;
  float *pfVar35;
  ushort uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 in_XMM7 [16];
  
  auVar20 = _DAT_001b3720;
  iVar2 = iimage->data_width;
  lVar25 = (long)iVar2;
  uVar3 = iimage->width;
  uVar24 = (ulong)(int)uVar3;
  uVar4 = iimage->height;
  pfVar5 = iimage->data;
  uVar30 = uVar3;
  if ((long)uVar24 < 0) {
    uVar30 = uVar3 + 3;
  }
  if (uVar3 + 3 < 7) {
    uVar31 = 0;
  }
  else {
    uVar31 = 0;
    auVar40 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar39 = vpermt2b_avx512vl(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar20,
                                  ZEXT432(*(uint *)(gray_image + uVar31)));
      auVar39 = vpsadbw_avx2(auVar39,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      auVar39 = vpaddd_avx2(auVar39,auVar40._0_32_);
      auVar37 = vpmovqd_avx512vl(auVar39);
      *(undefined1 (*) [16])(pfVar5 + uVar31) = auVar37;
      auVar39 = vpermq_avx2(auVar39,0xff);
      auVar40 = ZEXT3264(auVar39);
      uVar31 = uVar31 + 4;
    } while (uVar31 < (ulong)(long)(int)(uVar30 & 0xfffffffc));
  }
  if (uVar31 < uVar24) {
    fVar32 = pfVar5[uVar31 - 1];
    do {
      fVar32 = (float)((int)fVar32 + (uint)gray_image[uVar31]);
      pfVar5[uVar31] = fVar32;
      uVar31 = uVar31 + 1;
    } while (uVar24 != uVar31);
  }
  auVar20 = _DAT_001b3720;
  pfVar6 = iimage->data;
  if (1 < uVar4) {
    puVar29 = gray_image + uVar24;
    lVar34 = 1;
    pfVar33 = pfVar6;
    pfVar35 = pfVar5;
    pfVar26 = pfVar5;
    do {
      pfVar26 = pfVar26 + lVar25;
      if (uVar3 + 3 < 7) {
        uVar31 = 0;
      }
      else {
        auVar40 = ZEXT1664((undefined1  [16])0x0);
        uVar31 = 0;
        do {
          auVar39 = vpermt2b_avx512vl(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar20,
                                      ZEXT432(*(uint *)(puVar29 + uVar31)));
          auVar39 = vpsadbw_avx2(auVar39,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar39 = vpaddd_avx2(auVar39,auVar40._0_32_);
          auVar37 = *(undefined1 (*) [16])(pfVar35 + uVar31);
          auVar38 = vcvtdq2ps_avx(auVar37);
          pfVar1 = pfVar33 + uVar31;
          *pfVar1 = auVar38._0_4_ * 0.003921569;
          pfVar1[1] = auVar38._4_4_ * 0.003921569;
          pfVar1[2] = auVar38._8_4_ * 0.003921569;
          pfVar1[3] = auVar38._12_4_ * 0.003921569;
          auVar38 = vpmovqd_avx512vl(auVar39);
          auVar37 = vpaddd_avx(auVar37,auVar38);
          *(undefined1 (*) [16])(pfVar26 + uVar31) = auVar37;
          auVar39 = vpermq_avx2(auVar39,0xff);
          auVar40 = ZEXT3264(auVar39);
          uVar31 = uVar31 + 4;
        } while (uVar31 < (ulong)(long)(int)(uVar30 & 0xfffffffc));
      }
      if (uVar31 < uVar24) {
        iVar27 = (int)pfVar5[lVar34 * lVar25 + (uVar31 - 1)] -
                 (int)pfVar5[(lVar34 + -1) * lVar25 + (uVar31 - 1)];
        do {
          iVar27 = iVar27 + (uint)puVar29[uVar31];
          auVar37 = vcvtusi2ss_avx512f(in_XMM7,pfVar35[uVar31]);
          auVar38 = vcvtusi2ss_avx512f(in_XMM7,iVar27);
          fVar32 = (float)vcvttss2usi_avx512f(ZEXT416((uint)(auVar37._0_4_ + auVar38._0_4_)));
          pfVar26[uVar31] = fVar32;
          pfVar33[uVar31] = auVar37._0_4_ * 0.003921569;
          uVar31 = uVar31 + 1;
        } while (uVar24 != uVar31);
      }
      lVar34 = lVar34 + 1;
      pfVar33 = pfVar33 + lVar25;
      pfVar35 = pfVar35 + lVar25;
      puVar29 = puVar29 + uVar24;
    } while (lVar34 != (int)uVar4);
  }
  if ((int)(uVar24 - 7) == 0) {
    uVar31 = 0;
  }
  else {
    lVar25 = (long)(int)((uVar4 - 1) * iVar2);
    uVar31 = 0;
    do {
      auVar20 = vcvtdq2ps_avx(*(undefined1 (*) [32])(pfVar5 + lVar25 + uVar31));
      pfVar26 = pfVar6 + lVar25 + uVar31;
      *pfVar26 = auVar20._0_4_ * 0.003921569;
      pfVar26[1] = auVar20._4_4_ * 0.003921569;
      pfVar26[2] = auVar20._8_4_ * 0.003921569;
      pfVar26[3] = auVar20._12_4_ * 0.003921569;
      pfVar26[4] = auVar20._16_4_ * 0.003921569;
      pfVar26[5] = auVar20._20_4_ * 0.003921569;
      pfVar26[6] = auVar20._24_4_ * 0.003921569;
      pfVar26[7] = auVar20._28_4_;
      uVar31 = uVar31 + 8;
    } while (uVar31 < uVar24 - 7);
  }
  if (uVar31 <= uVar24 && uVar24 - uVar31 != 0) {
    auVar40 = vpbroadcastq_avx512f();
    lVar25 = uVar31 + (long)(int)((uVar4 - 1) * iVar2);
    uVar28 = 0;
    auVar41 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar42 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar43 = vbroadcastss_avx512f(ZEXT416(0x3b808081));
    do {
      auVar44 = vpbroadcastq_avx512f();
      auVar45 = vporq_avx512f(auVar44,auVar41);
      auVar44 = vporq_avx512f(auVar44,auVar42);
      uVar21 = vpcmpuq_avx512f(auVar44,auVar40,2);
      bVar22 = (byte)uVar21;
      uVar21 = vpcmpuq_avx512f(auVar45,auVar40,2);
      bVar23 = (byte)uVar21;
      uVar36 = CONCAT11(bVar23,bVar22);
      auVar44 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pfVar5 + lVar25 + uVar28));
      auVar45._4_4_ = (uint)((byte)(uVar36 >> 1) & 1) * auVar44._4_4_;
      auVar45._0_4_ = (uint)(bVar22 & 1) * auVar44._0_4_;
      auVar45._8_4_ = (uint)((byte)(uVar36 >> 2) & 1) * auVar44._8_4_;
      auVar45._12_4_ = (uint)((byte)(uVar36 >> 3) & 1) * auVar44._12_4_;
      auVar45._16_4_ = (uint)((byte)(uVar36 >> 4) & 1) * auVar44._16_4_;
      auVar45._20_4_ = (uint)((byte)(uVar36 >> 5) & 1) * auVar44._20_4_;
      auVar45._24_4_ = (uint)((byte)(uVar36 >> 6) & 1) * auVar44._24_4_;
      auVar45._28_4_ = (uint)((byte)(uVar36 >> 7) & 1) * auVar44._28_4_;
      auVar45._32_4_ = (uint)(bVar23 & 1) * auVar44._32_4_;
      auVar45._36_4_ = (uint)(bVar23 >> 1 & 1) * auVar44._36_4_;
      auVar45._40_4_ = (uint)(bVar23 >> 2 & 1) * auVar44._40_4_;
      auVar45._44_4_ = (uint)(bVar23 >> 3 & 1) * auVar44._44_4_;
      auVar45._48_4_ = (uint)(bVar23 >> 4 & 1) * auVar44._48_4_;
      auVar45._52_4_ = (uint)(bVar23 >> 5 & 1) * auVar44._52_4_;
      auVar45._56_4_ = (uint)(bVar23 >> 6 & 1) * auVar44._56_4_;
      auVar45._60_4_ = (uint)(bVar23 >> 7) * auVar44._60_4_;
      auVar44 = vcvtudq2ps_avx512f(auVar45);
      auVar44 = vmulps_avx512f(auVar44,auVar43);
      pfVar26 = pfVar6 + lVar25 + uVar28;
      bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
      bVar8 = (bool)((byte)(uVar36 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar36 >> 3) & 1);
      bVar10 = (bool)((byte)(uVar36 >> 4) & 1);
      bVar11 = (bool)((byte)(uVar36 >> 5) & 1);
      bVar12 = (bool)((byte)(uVar36 >> 6) & 1);
      bVar13 = (bool)((byte)(uVar36 >> 7) & 1);
      bVar14 = (bool)(bVar23 >> 1 & 1);
      bVar15 = (bool)(bVar23 >> 2 & 1);
      bVar16 = (bool)(bVar23 >> 3 & 1);
      bVar17 = (bool)(bVar23 >> 4 & 1);
      bVar18 = (bool)(bVar23 >> 5 & 1);
      bVar19 = (bool)(bVar23 >> 6 & 1);
      *pfVar26 = (float)((uint)(bVar22 & 1) * auVar44._0_4_ |
                        (uint)!(bool)(bVar22 & 1) * (int)*pfVar26);
      pfVar26[1] = (float)((uint)bVar7 * auVar44._4_4_ | (uint)!bVar7 * (int)pfVar26[1]);
      pfVar26[2] = (float)((uint)bVar8 * auVar44._8_4_ | (uint)!bVar8 * (int)pfVar26[2]);
      pfVar26[3] = (float)((uint)bVar9 * auVar44._12_4_ | (uint)!bVar9 * (int)pfVar26[3]);
      pfVar26[4] = (float)((uint)bVar10 * auVar44._16_4_ | (uint)!bVar10 * (int)pfVar26[4]);
      pfVar26[5] = (float)((uint)bVar11 * auVar44._20_4_ | (uint)!bVar11 * (int)pfVar26[5]);
      pfVar26[6] = (float)((uint)bVar12 * auVar44._24_4_ | (uint)!bVar12 * (int)pfVar26[6]);
      pfVar26[7] = (float)((uint)bVar13 * auVar44._28_4_ | (uint)!bVar13 * (int)pfVar26[7]);
      pfVar26[8] = (float)((uint)(bVar23 & 1) * auVar44._32_4_ |
                          (uint)!(bool)(bVar23 & 1) * (int)pfVar26[8]);
      pfVar26[9] = (float)((uint)bVar14 * auVar44._36_4_ | (uint)!bVar14 * (int)pfVar26[9]);
      pfVar26[10] = (float)((uint)bVar15 * auVar44._40_4_ | (uint)!bVar15 * (int)pfVar26[10]);
      pfVar26[0xb] = (float)((uint)bVar16 * auVar44._44_4_ | (uint)!bVar16 * (int)pfVar26[0xb]);
      pfVar26[0xc] = (float)((uint)bVar17 * auVar44._48_4_ | (uint)!bVar17 * (int)pfVar26[0xc]);
      pfVar26[0xd] = (float)((uint)bVar18 * auVar44._52_4_ | (uint)!bVar18 * (int)pfVar26[0xd]);
      pfVar26[0xe] = (float)((uint)bVar19 * auVar44._56_4_ | (uint)!bVar19 * (int)pfVar26[0xe]);
      pfVar26[0xf] = (float)((uint)(bVar23 >> 7) * auVar44._60_4_ |
                            (uint)!(bool)(bVar23 >> 7) * (int)pfVar26[0xf]);
      uVar28 = uVar28 + 0x10;
    } while (((uVar24 - uVar31) + 0xf & 0xfffffffffffffff0) != uVar28);
  }
  return;
}

Assistant:

void compute_integral_img_simd_early_cast_int(uint8_t *gray_image, struct integral_image *iimage) {
    
    // Implementation adapted from:
    // https://stackoverflow.com/questions/46520275/how-to-speed-up-calculation-of-integral-image
    // https://github.com/ermig1979/Simd/blob/master/src/Simd/SimdAvx2Integral.cpp

    int data_width = iimage->data_width;
    int width = iimage->width;
    int height = iimage->height;

    __m256i MASK = _mm256_setr_epi64x(0x00000000000000FF, 0x000000000000FFFF, 0x0000000000FFFFFF, 0x00000000FFFFFFFF);
    __m256i PACK = _mm256_setr_epi32(0, 2, 4, 6, 1, 3, 5, 7);
    //__m256i ZERO = _mm256_set1_epi32(0);
    __m256i ZERO = _mm256_setzero_si256();

    uint32_t *iimage_idata = (uint32_t *) iimage->data;

    size_t aligned_width = width / 4 * 4;

    {
        __m256i row_sums = ZERO;
        size_t i = 0;
        for(; i < aligned_width; i+=4) {

            // If (gray_image + i) has following uint8_t pixels: a b c d
            // a0000000 ab000000 abc00000 abcd0000
            __m256i img_rep_mask = _mm256_and_si256(_mm256_set1_epi32(*(uint32_t*)(gray_image + i)), MASK);
            
            // Summing together blocks of 8 uint8_t's and storing results
            // uint32_t eeee = a
            // uint32_t ffff = a + b
            // uint32_t gggg = a + b + c
            // uint32_t hhhh = a + b + c + d
            // eeee0000 ffff0000 gggg0000 hhhh0000
            __m256i img_sad_sum = _mm256_sad_epu8(img_rep_mask, ZERO);

            // Updating row_sum by adding previously computed img_sad_sum
            //   eeee0000 ffff0000 hhhh0000 hhhh0000
            // + iiii**** jjjj**** kkkk**** llll****
            // -------------------------------------
            //   mmmm**** nnnn**** oooo**** pppp****
            row_sums = _mm256_add_epi32(row_sums, img_sad_sum);

            // Permuting row_sum from first row to second and cutting off upper 128 bits
            // mmmm**** nnnn**** oooo**** pppp****
            // mmmmnnnn oooopppp ******** ********
            __m128i curr_row_sums = _mm256_castsi256_si128(_mm256_permutevar8x32_epi32(row_sums, PACK));
            
            // Storing 128 bits (4*uint32_t) in curr_row_sums back to memory
            // 
            _mm_storeu_si128((__m128i*)(iimage_idata + i), curr_row_sums); // For unaligned
            //_mm_store_si128((__m128i *)(iimage_idata + i), curr_row_sums);
            
            // Updating row_sums to only include highest of four values (pppp)
            // mmmm**** nnnn**** oooo**** pppp****
            // pppp**** pppp**** pppp**** pppp****
            row_sums = _mm256_permute4x64_epi64(row_sums, 0xFF);

        }
        uint32_t row_sum = iimage_idata[i - 1];
        for (; i < width; ++i) {
            row_sum += gray_image[i];
            iimage_idata[i] = row_sum;
        }
    }

    float *iimage_data = iimage->data;
    __m128 factor = _mm_set1_ps(1.0f / 255.0f);

    for(size_t j = 1; j < height; ++j) {

        __m256i row_sums = ZERO;

        size_t i = 0;
        for(; i < aligned_width; i+=4) {

            // If (gray_image + i) has following uint8_t pixels: a b c d
            // a0000000 ab000000 abc00000 abcd0000
            __m256i img_rep_mask = _mm256_and_si256(_mm256_set1_epi32(*(uint32_t*)(gray_image + j * width + i)), MASK);
            
            // Summing together blocks of 8 uint8_t's and storing results
            // uint32_t eeee = a
            // uint32_t ffff = a + b
            // uint32_t gggg = a + b + c
            // uint32_t hhhh = a + b + c + d
            // eeee0000 ffff0000 gggg0000 hhhh0000
            __m256i img_sad_sum = _mm256_sad_epu8(img_rep_mask, ZERO);

            // Updating row_sum by adding previously computed img_sad_sum
            //   eeee0000 ffff0000 hhhh0000 hhhh0000
            // + iiii**** jjjj**** kkkk**** llll****
            // -------------------------------------
            //   mmmm**** nnnn**** oooo**** pppp****
            row_sums = _mm256_add_epi32(row_sums, img_sad_sum);

            // Permuting row_sum from first row to second and cutting off upper 128 bits
            // mmmm**** nnnn**** oooo**** pppp****
            // mmmmnnnn oooopppp ******** ********
            __m128i curr_row_sums = _mm256_castsi256_si128(_mm256_permutevar8x32_epi32(row_sums, PACK));

            // Loading row_sum from previous row
            __m128i prev_row_sums = _mm_loadu_si128((__m128i *)(iimage_idata + (j-1) * data_width + i));
            //__m128i prev_row_sums = _mm_load_si128((__m128i *)(iimage_idata + (j-1) * data_width + i));

            // AVX512 only :(
            //__m128 prev_row_sums_cast = _mm_cvtepu32_ps(prev_row_sums);
            __m128 prev_row_sums_cast = _mm_cvtepi32_ps(prev_row_sums);
            //__128 prev_row_sums_cast = _my_mm_cvtepu32_ps(prev_row_sums);

            // Multiplying float version of previous row sum converted with (1.0f/255.0f) 
            __m128 prev_iimage_float = _mm_mul_ps(factor, prev_row_sums_cast);

            // Storing float of previous row sum back to memory as final integral image value
            _mm_storeu_ps(iimage_data +(j-1) * data_width + i, prev_iimage_float);

            // Adding curr_row_sums with prev_row_sums
            __m128i add_row_sums = _mm_add_epi32(curr_row_sums, prev_row_sums);

            // Storing 128 bits (4*uint32_t) in curr_row_sums back to memory
            _mm_storeu_si128((__m128i *)(iimage_idata + j * data_width + i), add_row_sums); // For unaligned
            //_mm_store_si128((__m128i *)(iimage_idata + j * data_width + i), add_row_sums);
            
            // Updating row_sums to only include highest of four values (pppp)
            // mmmm**** nnnn**** oooo**** pppp****
            // pppp**** pppp**** pppp**** pppp****
            row_sums = _mm256_permute4x64_epi64(row_sums, 0xFF);

        }

        uint32_t row_sum = iimage_idata[j * data_width + i - 1] - iimage_idata[(j-1) * data_width + i - 1];
        for (; i < width; ++i) {
            row_sum += gray_image[j * width + i];
            float prev_row_sum = iimage_idata[(j-1) * data_width + i];
            iimage_idata[j * data_width + i] = row_sum + prev_row_sum;
            iimage_data[(j-1) * data_width + i] = (1.0f / 255.0f) * ((float) prev_row_sum);
        }

    }

    // Converting last row to floats
    __m256 factor256 = _mm256_set1_ps(1.0f / 255.0f);
    size_t i = 0;
    for (; i < width - 7; i+=8) {

        __m256i v_int = _mm256_loadu_si256((__m256i *)(iimage_idata + (height - 1) * data_width + i));
        //__m256i v_int = _mm256_load_si256((__m256i *)(iimage_idata + j * data_width + i));

        // AVX512 only :(
        //__m256 v_float = _mm256_cvtepu32_ps(v_int);
        __m256 v_float = _mm256_cvtepi32_ps(v_int);
        //__m256 v_float = _my_mm256_cvtepu32_ps(v_int);

        // Multiplying converted float with (1.0f/255.0f) 
        __m256 v_iimage = _mm256_mul_ps(factor256, v_float);

        // Storing value back to memory
        _mm256_storeu_ps(iimage_data + (height - 1) * data_width + i, v_iimage);

    } 

    for (; i < width; ++i) {
        iimage_data[(height - 1) * data_width + i] = (1.0f / 255.0f) * ((float) iimage_idata[(height - 1) * data_width + i]);
    }

}